

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O2

void * gdImageGifAnimAddPtr
                 (gdImagePtr im,int *size,int LocalCM,int LeftOfs,int TopOfs,int Delay,int Disposal,
                 gdImagePtr previm)

{
  gdIOCtx *out;
  void *pvVar1;
  
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out == (gdIOCtx *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    gdImageGifAnimAddCtx(im,out,LocalCM,LeftOfs,TopOfs,Delay,Disposal,previm);
    pvVar1 = gdDPExtractData(out,size);
    (*out->gd_free)(out);
  }
  return pvVar1;
}

Assistant:

BGD_DECLARE(void *) gdImageGifAnimAddPtr(gdImagePtr im, int *size, int LocalCM,
                                         int LeftOfs, int TopOfs, int Delay,
                                         int Disposal, gdImagePtr previm)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	gdImageGifAnimAddCtx(im, out, LocalCM, LeftOfs, TopOfs, Delay, Disposal, previm);
	rv = gdDPExtractData(out, size);
	out->gd_free(out);
	return rv;
}